

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_getbase(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  bool bVar2;
  SQRESULT SVar3;
  SQObjectPtr *o;
  SQObjectPtr *local_20;
  SQObjectPtr local_18;
  
  local_20 = (SQObjectPtr *)0x0;
  bVar2 = sq_aux_gettypedarg(v,idx,OT_CLASS,&local_20);
  SVar3 = -1;
  if (bVar2) {
    if (((local_20->super_SQObject)._unVal.pTable)->_firstfree == (_HashNode *)0x0) {
      SQVM::PushNull(v);
    }
    else {
      local_18.super_SQObject._unVal =
           (SQObjectValue)((local_20->super_SQObject)._unVal.pClosure)->_root;
      local_18.super_SQObject._type = OT_CLASS;
      pSVar1 = &((local_18.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
      SQVM::Push(v,&local_18);
      SQObjectPtr::~SQObjectPtr(&local_18);
    }
    SVar3 = 0;
  }
  return SVar3;
}

Assistant:

SQRESULT sq_getbase(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr *o = NULL;
    _GETSAFE_OBJ(v, idx, OT_CLASS,o);
    if(_class(*o)->_base)
        v->Push(SQObjectPtr(_class(*o)->_base));
    else
        v->PushNull();
    return SQ_OK;
}